

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

Image * GetScreenData(void)

{
  int width;
  int height;
  uchar *puVar1;
  Image *in_RDI;
  
  in_RDI->data = (void *)0x0;
  in_RDI->width = 0;
  in_RDI->height = 0;
  in_RDI->mipmaps = 0;
  in_RDI->format = 0;
  width = GetScreenWidth();
  in_RDI->width = width;
  height = GetScreenHeight();
  in_RDI->height = height;
  in_RDI->mipmaps = 1;
  in_RDI->format = 7;
  puVar1 = rlReadScreenPixels(width,height);
  in_RDI->data = puVar1;
  return in_RDI;
}

Assistant:

Image GetScreenData(void)
{
    Image image = { 0 };

    image.width = GetScreenWidth();
    image.height = GetScreenHeight();
    image.mipmaps = 1;
    image.format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;
    image.data = rlReadScreenPixels(image.width, image.height);

    return image;
}